

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countdown_latch_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::CountdownLatchTest_TestCountdownLatchFromZeroIndefiniteAwait_Test::TestBody
          (CountdownLatchTest_TestCountdownLatchFromZeroIndefiniteAwait_Test *this)

{
  bool bVar1;
  future_status fVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Result_base *this_00;
  undefined8 uVar4;
  pointer *__ptr;
  char *in_R9;
  _State_baseV2 *__tmp;
  AssertionResult gtest_ar_;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  future<void> asyncFuture;
  CountdownLatch latch;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  _func_int **local_d0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  AssertHelper local_c0;
  undefined1 local_b8 [32];
  __basic_future<void> local_98;
  CountdownLatch local_88 [96];
  
  bidfx_public_api::tools::CountdownLatch::CountdownLatch(local_88,0);
  local_b8._0_8_ = (element_type *)0x0;
  local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00298988;
  p_Var3[1]._M_use_count = 0;
  p_Var3[1]._M_weak_count = 0;
  *(undefined4 *)&p_Var3[2]._vptr__Sp_counted_base = 0;
  *(undefined1 *)((long)&p_Var3[2]._vptr__Sp_counted_base + 4) = 0;
  p_Var3[2]._M_use_count = 0;
  p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[3]._M_use_count = 0;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_002989d8;
  this_00 = (_Result_base *)operator_new(0x10);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  std::__future_base::_Result_base::_Result_base(this_00);
  *(undefined ***)this_00 = &PTR__M_destroy_00298d08;
  p_Var3[4]._vptr__Sp_counted_base = (_func_int **)this_00;
  *(CountdownLatch **)&p_Var3[4]._M_use_count = local_88;
  local_d0 = (_func_int **)0x0;
  local_d8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
  ;
  *(undefined ***)local_d8.ptr_ = &PTR___State_00298a30;
  *(element_type **)(local_d8.ptr_ + 8) = (element_type *)(p_Var3 + 1);
  *(code **)(local_d8.ptr_ + 0x10) =
       std::__future_base::
       _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp:85:33)>_>,_void>
       ::_M_run;
  *(long *)(local_d8.ptr_ + 0x18) = 0;
  std::thread::_M_start_thread(&local_d0,&local_d8,0);
  if (local_d8.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_d8.ptr_ + 8))();
  }
  if (p_Var3[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
    std::terminate();
  }
  p_Var3[3]._vptr__Sp_counted_base = local_d0;
  local_b8._0_8_ = (element_type *)(p_Var3 + 1);
  local_b8._8_8_ = p_Var3;
  std::__basic_future<void>::__basic_future(&local_98,(__state_type *)local_b8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
  }
  local_b8._0_8_ = (element_type *)0x1388;
  if (local_98._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_State_baseV2 *)0x0) {
    fVar2 = std::__future_base::_State_baseV2::wait_for<long,std::ratio<1l,1000l>>
                      (local_98._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(duration<long,_std::ratio<1L,_1000L>_> *)local_b8);
    local_d0 = (_func_int **)CONCAT71(local_d0._1_7_,fVar2 != timeout);
    local_c8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (fVar2 == timeout) {
      testing::Message::Message((Message *)&local_d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_b8,(internal *)&local_d0,
                 (AssertionResult *)
                 "asyncFuture.wait_for(std::chrono::milliseconds(5000)) != std::future_status::timeout"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
                 ,0x58,(char *)local_b8._0_8_);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if ((element_type *)local_b8._0_8_ != (element_type *)(local_b8 + 0x10)) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
      }
      if (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_d8.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_98._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::condition_variable::~condition_variable((condition_variable *)local_88);
    return;
  }
  uVar4 = std::__throw_future_error(3);
  __clang_call_terminate(uVar4);
}

Assistant:

TEST(CountdownLatchTest, TestCountdownLatchFromZeroIndefiniteAwait)
{
    CountdownLatch latch = CountdownLatch(0);
    auto asyncFuture = std::async(
            std::launch::async, [&latch]() {
                latch.Await();
            });
    EXPECT_TRUE(asyncFuture.wait_for(std::chrono::milliseconds(5000)) != std::future_status::timeout);
}